

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

void __thiscall helics::apps::Recorder::addSubscription(Recorder *this,string_view key)

{
  bool bVar1;
  int iVar2;
  InterfaceHandle IVar3;
  pointer ppVar4;
  Input *this_00;
  Input *__args;
  size_type sVar5;
  reference this_01;
  mapped_type *pmVar6;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  bool bVar7;
  __sv_type _Var8;
  ValueFederate *in_stack_00000030;
  undefined1 in_stack_00000038 [16];
  InterfaceHandle subId;
  int index;
  iterator res;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  deque<helics::Input,_std::allocator<helics::Input>_> *in_stack_ffffffffffffff80;
  key_type *local_60;
  int iVar9;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined8 local_38;
  undefined8 local_30;
  _Self local_28;
  _Self local_20 [2];
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDX;
  local_20[0]._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::find(in_stack_ffffffffffffff68,(key_type *)0x179f70);
  local_28._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::end(in_stack_ffffffffffffff68);
  bVar1 = CLI::std::operator==(local_20,&local_28);
  bVar7 = true;
  if (!bVar1) {
    ppVar4 = CLI::std::
             _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                           *)0x179fb1);
    bVar7 = ppVar4->second == -1;
  }
  if (bVar7) {
    this_00 = (Input *)(in_RDI + 0xd0);
    __args = (Input *)CLI::std::
                      __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x179fe5);
    local_38 = local_10;
    local_30 = local_8;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48);
    helics::ValueFederate::registerSubscription
              (in_stack_00000030,_subId,(string_view)in_stack_00000038);
    std::deque<helics::Input,std::allocator<helics::Input>>::emplace_back<helics::Input&>
              ((deque<helics::Input,_std::allocator<helics::Input>_> *)this_00,__args);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff80,
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    sVar5 = CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::size
                      ((deque<helics::Input,_std::allocator<helics::Input>_> *)0x17a061);
    iVar2 = (int)sVar5 + -1;
    this_01 = CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::back
                        (in_stack_ffffffffffffff80);
    IVar3 = Interface::getHandle(&this_01->super_Interface);
    iVar9 = iVar2;
    pmVar6 = CLI::std::
             map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
             ::operator[]((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
                           *)CONCAT44(iVar2,IVar3.hid),local_60);
    *pmVar6 = iVar2;
    iVar2 = iVar9;
    CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::back
              ((deque<helics::Input,_std::allocator<helics::Input>_> *)(in_RDI + 0x1d8));
    Input::getTarget_abi_cxx11_(this_00);
    _Var8 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00)
    ;
    pmVar6 = CLI::std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[]((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                           *)CONCAT44(iVar2,IVar3.hid),(key_type *)_Var8._M_str);
    *pmVar6 = iVar9;
  }
  return;
}

Assistant:

void Recorder::addSubscription(std::string_view key)
{
    auto res = subkeys.find(key);
    if ((res == subkeys.end()) || (res->second == -1)) {
        subscriptions.emplace_back(fed->registerSubscription(key));
        targets.emplace_back(key);
        auto index = static_cast<int>(subscriptions.size()) - 1;
        auto subId = subscriptions.back().getHandle();
        subids[subId] = index;  // this is a new element
        subkeys[subscriptions.back().getTarget()] = index;  // this is a potential replacement
    }
}